

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M_tree.cpp
# Opt level: O0

void __thiscall M_tree::M_tree(M_tree *this)

{
  M_tree *this_local;
  
  this->_vptr_M_tree = (_func_int **)&PTR__M_tree_00114d88;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->file_names_p);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->file_names_ol);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->file_names_of);
  std::vector<Node_*,_std::allocator<Node_*>_>::vector(&this->point_p);
  std::vector<Node_*,_std::allocator<Node_*>_>::vector(&this->point_ol);
  std::vector<Node_*,_std::allocator<Node_*>_>::vector(&this->point_of);
  std::__cxx11::string::string((string *)&this->folder_name1);
  std::__cxx11::string::string((string *)&this->folder_name2);
  this->treesize = 0;
  this->pNode = (Node *)0x0;
  this->oldpNode = (Node *)0x0;
  this->ofolder = (Node *)0x0;
  return;
}

Assistant:

M_tree::M_tree() {
    this->treesize = 0;
    this->pNode = NULL;
    this->oldpNode = NULL;
    this->ofolder = NULL;
}